

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.hpp
# Opt level: O0

container<pstore::repo::internal_fixup> __thiscall
pstore::repo::debug_line_dispatcher::ifixups(debug_line_dispatcher *this)

{
  container<pstore::repo::internal_fixup> cVar1;
  debug_line_dispatcher *this_local;
  
  cVar1 = debug_line_section::ifixups(this->d_);
  return cVar1;
}

Assistant:

container<internal_fixup> ifixups () const final { return d_.ifixups (); }